

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Intercom_Control_PDU::Decode
          (Intercom_Control_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  KUINT32 KVar3;
  allocator<char> local_41;
  IntercomCommunicationParameters icp;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x27 < iVar2 + (uint)KVar1) {
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    KDataStream::Read(stream,&(this->super_Header).super_Header6.field_0x27);
    (*(this->m_CommChannelType).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_CommChannelType,stream);
    (*(this->m_SrcEnt).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_SrcEnt,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16SrcCommDevID);
    KDataStream::Read(stream,&this->m_ui8SrcLineID);
    KDataStream::Read(stream,&this->m_ui8TransmitPriority);
    KDataStream::Read(stream,&this->m_ui8TransmitLineState);
    KDataStream::Read(stream,&this->m_ui8Command);
    (*(this->m_MstrEntID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_MstrEntID,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16MstrCommDeviceID);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16MstrChannelID);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32IntrParamLen);
    std::
    vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
    ::clear(&this->m_vICP);
    for (KVar3 = this->m_ui32IntrParamLen; KVar3 != 0; KVar3 = (KVar3 - KVar1) - 4) {
      DATA_TYPE::IntercomCommunicationParameters::IntercomCommunicationParameters(&icp,stream);
      std::
      vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
      ::push_back(&this->m_vICP,&icp);
      KVar1 = DATA_TYPE::IntercomCommunicationParameters::GetLength(&icp);
      DATA_TYPE::IntercomCommunicationParameters::~IntercomCommunicationParameters(&icp);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&icp,"Decode",&local_41);
  KException::KException(this_00,(KString *)&icp,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Intercom_Control_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < INTERCOM_CONTROL_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> m_ui8CtrlTyp
           >> KDIS_STREAM m_CommChannelType
           >> KDIS_STREAM m_SrcEnt
           >> m_ui16SrcCommDevID
           >> m_ui8SrcLineID
           >> m_ui8TransmitPriority
           >> m_ui8TransmitLineState
           >> m_ui8Command
           >> KDIS_STREAM m_MstrEntID
           >> m_ui16MstrCommDeviceID
           >> m_ui16MstrChannelID
           >> m_ui32IntrParamLen;

    m_vICP.clear();

    // Using the parameter length field to decode each parameter.
    KUINT32 ParamLength = m_ui32IntrParamLen;

    while( ParamLength )
    {
        IntercomCommunicationParameters icp( stream );

        m_vICP.push_back( icp );

        ParamLength -= icp.GetLength() + IntercomCommunicationParameters::INTERCOM_COMMS_PARAM_SIZE;
    }
}